

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2c.c
# Opt level: O2

void envy_bios_print_i2c(envy_bios *bios,FILE *out,uint mask)

{
  byte bVar1;
  ushort uVar2;
  envy_bios_i2c_entry *peVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  uVar2 = (bios->i2c).offset;
  if ((mask >> 0x12 & 1) == 0 || uVar2 == 0) {
    return;
  }
  bVar1 = (bios->i2c).version;
  uVar6 = (ulong)(bVar1 >> 4);
  uVar5 = (ulong)(bVar1 & 0xf);
  if ((bios->i2c).valid == '\0') {
    fprintf((FILE *)out,"Failed to parse I2C table at 0x%04x version %d.%d\n\n",(ulong)uVar2,uVar6,
            uVar5);
    return;
  }
  fprintf((FILE *)out,"I2C table at 0x%04x version %d.%d",(ulong)uVar2,uVar6,uVar5);
  fprintf((FILE *)out," defaults %d %d",(ulong)(bios->i2c).def[0],(ulong)(bios->i2c).def[1]);
  fputc(10,(FILE *)out);
  envy_bios_dump_hex(bios,out,(uint)(bios->i2c).offset,(uint)(bios->i2c).hlen,mask);
  lVar7 = 0xc;
  uVar6 = 0;
  do {
    if ((bios->i2c).entriesnum <= uVar6) {
      fputc(10,(FILE *)out);
      return;
    }
    peVar3 = (bios->i2c).entries;
    bVar1 = *(byte *)((long)peVar3 + lVar7 + -10);
    if (((mask >> 0x1e & 1) != 0) || (bVar1 != 0xff)) {
      pcVar4 = find_enum(i2c_types,(uint)bVar1);
      fprintf((FILE *)out,"I2C %d:",uVar6 & 0xffffffff);
      fprintf((FILE *)out," type 0x%02x [%s]",(ulong)*(byte *)((long)peVar3 + lVar7 + -10),pcVar4);
      bVar1 = *(byte *)((long)peVar3 + lVar7 + -10);
      if (bVar1 - 5 < 2) {
        fprintf((FILE *)out," loc %d",(ulong)*(byte *)((long)peVar3 + lVar7 + -7));
        if (*(char *)((long)peVar3 + lVar7 + -6) != '\0') {
          fprintf((FILE *)out," unk00_4 %d");
        }
        pcVar4 = " shared %d";
        if ((*(char *)((long)peVar3 + lVar7 + -4) != '\0') ||
           (pcVar4 = " unk01_1 %d", *(char *)((long)peVar3 + lVar7 + -3) != '\0')) {
          fprintf((FILE *)out,pcVar4);
        }
        bVar1 = *(byte *)((long)peVar3 + lVar7 + -2);
        uVar5 = (ulong)bVar1;
        if (bVar1 != 0) {
          pcVar4 = " unk01_5 %d";
          goto LAB_00254a06;
        }
LAB_00254a0d:
        bVar1 = *(byte *)((long)&peVar3->offset + lVar7);
        if (bVar1 != 0) {
          fprintf((FILE *)out," unk02 0x%02x",(ulong)bVar1);
        }
      }
      else {
        if (bVar1 == 4) {
          fprintf((FILE *)out," loc %d",(ulong)*(byte *)((long)peVar3 + lVar7 + -7));
          if (*(char *)((long)peVar3 + lVar7 + -6) != '\0') {
            fprintf((FILE *)out," unk00_4 %d");
          }
          uVar5 = (ulong)*(byte *)((long)peVar3 + lVar7 + -5);
          pcVar4 = " addr 0x%02x";
LAB_00254a06:
          fprintf((FILE *)out,pcVar4,uVar5);
          goto LAB_00254a0d;
        }
        if (bVar1 == 0) {
          fprintf((FILE *)out," wr 0x%02x",(ulong)*(byte *)((long)peVar3 + lVar7 + -9));
          uVar5 = (ulong)*(byte *)((long)peVar3 + lVar7 + -8);
          pcVar4 = " rd 0x%02x";
          goto LAB_00254a06;
        }
      }
      fputc(10,(FILE *)out);
    }
    envy_bios_dump_hex(bios,out,(uint)*(ushort *)((long)peVar3 + lVar7 + -0xc),
                       (uint)(bios->i2c).rlen,mask);
    uVar6 = uVar6 + 1;
    lVar7 = lVar7 + 0xe;
  } while( true );
}

Assistant:

void envy_bios_print_i2c (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_i2c *i2c = &bios->i2c;
	if (!i2c->offset || !(mask & ENVY_BIOS_PRINT_I2C))
		return;
	if (!i2c->valid) {
		fprintf(out, "Failed to parse I2C table at 0x%04x version %d.%d\n\n", i2c->offset, i2c->version >> 4, i2c->version & 0xf);
		return;
	}
	fprintf(out, "I2C table at 0x%04x version %d.%d", i2c->offset, i2c->version >> 4, i2c->version & 0xf);
	fprintf(out, " defaults %d %d", i2c->def[0], i2c->def[1]);
	fprintf(out, "\n");
	envy_bios_dump_hex(bios, out, i2c->offset, i2c->hlen, mask);
	int i;
	for (i = 0; i < i2c->entriesnum; i++) {
		struct envy_bios_i2c_entry *entry = &i2c->entries[i];
		if (entry->type != ENVY_BIOS_I2C_UNUSED || mask & ENVY_BIOS_PRINT_UNUSED) {
			const char *typename = find_enum(i2c_types, entry->type);
			fprintf(out, "I2C %d:", i);
			fprintf(out, " type 0x%02x [%s]", entry->type, typename);
			switch (entry->type) {
				case ENVY_BIOS_I2C_VGACR:
					fprintf(out, " wr 0x%02x", entry->vgacr_wr);
					fprintf(out, " rd 0x%02x", entry->vgacr_rd);
					if (entry->unk02)
						fprintf(out, " unk02 0x%02x", entry->unk02);
					break;
				case ENVY_BIOS_I2C_PCRTC:
					fprintf(out, " loc %d", entry->loc);
					if (entry->unk00_4)
						fprintf(out, " unk00_4 %d", entry->unk00_4);
					fprintf(out, " addr 0x%02x", entry->addr);
					if (entry->unk02)
						fprintf(out, " unk02 0x%02x", entry->unk02);
					break;
				case ENVY_BIOS_I2C_PNVIO:
				case ENVY_BIOS_I2C_AUXCH:
					fprintf(out, " loc %d", entry->loc);
					if (entry->unk00_4)
						fprintf(out, " unk00_4 %d", entry->unk00_4);
					if (entry->shared)
						fprintf(out, " shared %d", entry->sharedid);
					else if (entry->sharedid)
						fprintf(out, " unk01_1 %d", entry->sharedid);
					if (entry->unk01_5)
						fprintf(out, " unk01_5 %d", entry->unk01_5);
					if (entry->unk02)
						fprintf(out, " unk02 0x%02x", entry->unk02);
					break;
			}
			fprintf(out, "\n");
		}
		envy_bios_dump_hex(bios, out, entry->offset, i2c->rlen, mask);
	}
	fprintf(out, "\n");
}